

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListGraph.c
# Opt level: O3

int get_weight(LGraph G,int start,int end)

{
  int iVar1;
  ENode *pEVar2;
  
  iVar1 = 0;
  if (start != end) {
    iVar1 = 0x7fffffff;
    for (pEVar2 = G.vexs[start].first_edge; pEVar2 != (ENode *)0x0; pEVar2 = pEVar2->next_edge) {
      if (pEVar2->ivex == end) {
        return pEVar2->weight;
      }
    }
  }
  return iVar1;
}

Assistant:

int get_weight(LGraph G, int start, int end)
{
    ENode *node;

    if (start==end)
        return 0;

    node = G.vexs[start].first_edge;
    while (node!=NULL)
    {
        if (end==node->ivex)
            return node->weight;
        node = node->next_edge;
    }

    return INF;
}